

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextWrapped(ImVec2 pos,char *text,char *text_end,float wrap_width)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined4 in_XMM1_Da;
  float unaff_retaddr;
  ImFont *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImVec4 *in_stack_00000020;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_00000038;
  float in_stack_ffffffffffffffc0;
  ImGuiContext *pIVar2;
  undefined4 in_stack_ffffffffffffffe0;
  char *pcVar3;
  ImVec2 *pos_00;
  
  pos_00 = (ImVec2 *)vmovlpd_avx(in_ZMM0._0_16_);
  pIVar2 = GImGui;
  pcVar3 = in_RDI;
  if (in_RSI == (char *)0x0) {
    sVar1 = strlen(in_RDI);
    in_RSI = in_RDI + sVar1;
  }
  if (pcVar3 != in_RSI) {
    GetColorU32((ImGuiCol)pIVar2->FontSize,in_stack_ffffffffffffffc0);
    ImDrawList::AddText(in_stack_00000010,in_stack_00000008,unaff_retaddr,pos_00,
                        (ImU32)((ulong)pcVar3 >> 0x20),in_RSI,
                        (char *)CONCAT44(in_XMM1_Da,in_stack_ffffffffffffffe0),
                        (float)((ulong)pIVar2 >> 0x20),in_stack_00000020);
    if ((pIVar2->LogEnabled & 1U) != 0) {
      LogRenderedText((ImVec2 *)text_end,(char *)CONCAT44(wrap_width,in_stack_00000038),
                      &g->Initialized);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextWrapped(ImVec2 pos, const char* text, const char* text_end, float wrap_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = text + strlen(text); // FIXME-OPT

    if (text != text_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_end, wrap_width);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_end);
    }
}